

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exp.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeExp(ConvertLayerParameters layerParameters)

{
  int iVar1;
  Rep *pRVar2;
  string *layerName;
  Type *pTVar3;
  NeuralNetworkLayer *this;
  UnaryFunctionLayerParams *pUVar4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  ExpParameter *pEVar8;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_70;
  string local_50;
  
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                      *layerParameters.layerId);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (layerParameters.nnWrite);
  if (((pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
     ((pTVar3->top_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    lVar7 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_a8,"Must have 1 input and 1 output",(allocator *)&local_70);
    errorInCaffeProto(&local_a8,(pTVar3->name_).ptr_,(pTVar3->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_a8);
    lVar7 = (long)(pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar3->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar6 = 0; lVar7 * 8 != lVar6; lVar6 = lVar6 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&bottom,*(value_type **)((long)ppvVar5 + lVar6));
  }
  pRVar2 = (pTVar3->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  iVar1 = (pTVar3->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar7 = 0; (long)iVar1 * 8 != lVar7; lVar7 = lVar7 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&top,*(value_type **)((long)ppvVar5 + lVar7));
  }
  convertCaffeMetadata
            ((pTVar3->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  pEVar8 = pTVar3->exp_param_;
  if (pEVar8 == (ExpParameter *)0x0) {
    pEVar8 = (ExpParameter *)&caffe::_ExpParameter_default_instance_;
  }
  if (1e-05 < ABS(pEVar8->base_ + 1.0)) {
    std::__cxx11::string::string((string *)&local_a8,"base",&local_d9);
    layerName = (pTVar3->name_).ptr_;
    std::__cxx11::string::string((string *)&local_70,"Exp",&local_da);
    std::__cxx11::string::string((string *)&local_50,"non e base",&local_db);
    unsupportedCaffeParrameterWithOption(&local_a8,layerName,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  pUVar4 = CoreML::Specification::NeuralNetworkLayer::mutable_unary(this);
  pUVar4->type_ = 4;
  pUVar4->shift_ = pEVar8->shift_;
  pUVar4->scale_ = pEVar8->scale_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&top);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bottom);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeExp(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ExpParameter& caffeLayerParams = caffeLayer.exp_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (std::abs(caffeLayerParams.base()+1) > 1e-5f) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("base",caffeLayer.name(), "Exp", "non e base");
    }
    //***************************************************************
    
    Specification::UnaryFunctionLayerParams* specLayerParams = specLayer->mutable_unary();
    specLayerParams->set_type(Specification::UnaryFunctionLayerParams::EXP);
    specLayerParams->set_shift(caffeLayerParams.shift());
    specLayerParams->set_scale(caffeLayerParams.scale());
    
}